

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_avx2.c
# Opt level: O0

void av1_txb_init_levels_avx2(tran_low_t *coeff,int width,int height,uint8_t *levels)

{
  __m256i v;
  __m256i v_00;
  __m256i v_01;
  int iVar1;
  ulong uVar2;
  void *in_RCX;
  int in_EDX;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  int iVar3;
  void *in_RSI;
  __m256i *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  __m128i v_02;
  __m128i v_03;
  __m128i v_04;
  __m128i v_05;
  __m128i v_06;
  __m128i v_07;
  __m256i res_3;
  __m256i res__3;
  __m256i absABCD_2;
  __m256i absCD_2;
  __m256i absAB_2;
  __m256i coeffCD_2;
  __m256i coeffAB_2;
  __m256i coeffD_2;
  __m256i coeffC_2;
  __m256i coeffB_2;
  __m256i coeffA_2;
  __m256i res_2;
  __m256i res__2;
  __m256i absABCD_1;
  __m256i absCD_1;
  __m256i absAB_1;
  __m256i coeffCD_1;
  __m256i coeffAB_1;
  __m256i coeffD_1;
  __m256i coeffC_1;
  __m256i coeffB_1;
  __m256i coeffA_1;
  __m128i res1;
  __m128i res0;
  __m256i res_1;
  __m256i res__1;
  __m256i absABCD;
  __m256i absCD;
  __m256i absAB;
  __m256i coeffCD;
  __m256i coeffAB;
  __m256i coeffD;
  __m256i coeffC;
  __m256i coeffB;
  __m256i coeffA;
  __m256i res;
  __m256i res_;
  __m256i abs01_8;
  __m256i abs01;
  __m256i c1;
  __m256i c0;
  tran_low_t *cf;
  uint8_t *ls;
  int i;
  uint8_t *bottom_buf;
  uint8_t *bottom_buf_end;
  int32_t bottom_len;
  __m256i y_zeros;
  int stride;
  undefined1 in_stack_fffffffffffff640 [24];
  undefined1 auVar10 [24];
  undefined1 in_stack_fffffffffffff660 [32];
  undefined1 auStack_850 [16];
  undefined1 local_700 [16];
  undefined1 auStack_6d0 [16];
  __m256i *local_4b0;
  void *local_4a8;
  int local_49c;
  ulong local_498;
  
  iVar3 = (int)in_RSI;
  iVar1 = in_EDX + 4;
  uVar2 = (long)in_RCX + (long)((iVar3 + 4) * iVar1);
  local_498 = uVar2 - (long)(int)(iVar1 * 4 + 0x1fU & 0xffffffe0);
  do {
    auVar9 = ZEXT1664(ZEXT816(0));
    v[1] = in_stack_fffffffffffff640._0_8_;
    v[2] = in_stack_fffffffffffff640._8_8_;
    v[3] = in_stack_fffffffffffff640._16_8_;
    v[0] = 0xab7e0a;
    yy_storeu_256(in_stack_fffffffffffff660._16_8_,v);
    local_498 = local_498 + 0x20;
  } while (local_498 < uVar2);
  local_49c = 0;
  local_4b0 = in_RDI;
  if (in_EDX == 4) {
    do {
      auVar8 = auVar9._0_32_;
      yy_loadu_256(local_4b0,in_RSI);
      auVar5 = auVar8;
      yy_loadu_256(local_4b0 + 1,in_RSI);
      auVar5 = vpackssdw_avx2(auVar8,auVar5);
      auVar5 = vpabsw_avx2(auVar5);
      auVar5 = vpacksswb_avx2(auVar5,ZEXT1632(ZEXT816(0)));
      auVar5 = vpshufd_avx2(auVar5,0xd8);
      auVar5 = vpermq_avx2(auVar5,0xd8);
      auVar9 = ZEXT3264(auVar5);
      v_00[1] = in_stack_fffffffffffff640._0_8_;
      v_00[2] = in_stack_fffffffffffff640._8_8_;
      v_00[3] = in_stack_fffffffffffff640._16_8_;
      v_00[0] = 0xab7f79;
      yy_storeu_256(in_stack_fffffffffffff660._16_8_,v_00);
      local_4b0 = local_4b0 + 2;
      local_49c = local_49c + 4;
    } while (local_49c < iVar3);
  }
  else {
    local_4a8 = in_RCX;
    if (in_EDX == 8) {
      do {
        auVar6 = auVar9._0_32_;
        yy_loadu_256(local_4b0,in_RSI);
        auVar5 = auVar6;
        yy_loadu_256(local_4b0 + 1,in_RSI);
        auVar7 = auVar5;
        yy_loadu_256(local_4b0 + 2,in_RSI);
        auVar8 = auVar7;
        yy_loadu_256(local_4b0 + 3,in_RSI);
        auVar5 = vpackssdw_avx2(auVar6,auVar5);
        auVar8 = vpackssdw_avx2(auVar7,auVar8);
        auVar5 = vpabsw_avx2(auVar5);
        auVar8 = vpabsw_avx2(auVar8);
        auVar5 = vpacksswb_avx2(auVar5,auVar8);
        auVar5 = vpermq_avx2(auVar5,0xd8);
        auVar5 = vpshufd_avx2(auVar5,0xd8);
        auStack_6d0 = auVar5._16_16_;
        v_02[1] = extraout_RDX;
        v_02[0] = (longlong)in_RSI;
        xx_storel_64(local_4a8,v_02);
        *(undefined4 *)((long)local_4a8 + 8) = 0;
        vpsrldq_avx(auStack_6d0,8);
        v_03[1] = extraout_RDX_00;
        v_03[0] = (longlong)in_RSI;
        xx_storel_64((void *)((long)local_4a8 + (long)iVar1),v_03);
        *(undefined4 *)((long)local_4a8 + (long)iVar1 + 8) = 0;
        v_04[1] = extraout_RDX_01;
        v_04[0] = (longlong)in_RSI;
        xx_storel_64((void *)((long)local_4a8 + (long)(iVar1 * 2)),v_04);
        *(undefined4 *)((long)local_4a8 + (long)(iVar1 * 2) + 8) = 0;
        auVar4 = vpsrldq_avx(local_700,8);
        auVar9 = ZEXT1664(auVar4);
        v_05[1] = extraout_RDX_02;
        v_05[0] = (longlong)in_RSI;
        xx_storel_64((void *)((long)local_4a8 + (long)(iVar1 * 3)),v_05);
        *(undefined4 *)((long)local_4a8 + (long)(iVar1 * 3) + 8) = 0;
        local_4b0 = local_4b0 + 4;
        local_4a8 = (void *)((long)local_4a8 + (long)(iVar1 * 4));
        local_49c = local_49c + 4;
      } while (local_49c < iVar3);
    }
    else if (in_EDX == 0x10) {
      do {
        auVar6 = auVar9._0_32_;
        yy_loadu_256(local_4b0,in_RSI);
        auVar5 = auVar6;
        yy_loadu_256(local_4b0 + 1,in_RSI);
        auVar7 = auVar5;
        yy_loadu_256(local_4b0 + 2,in_RSI);
        auVar8 = auVar7;
        yy_loadu_256(local_4b0 + 3,in_RSI);
        auVar5 = vpackssdw_avx2(auVar6,auVar5);
        auVar8 = vpackssdw_avx2(auVar7,auVar8);
        auVar5 = vpabsw_avx2(auVar5);
        auVar8 = vpabsw_avx2(auVar8);
        auVar5 = vpacksswb_avx2(auVar5,auVar8);
        auVar5 = vpermq_avx2(auVar5,0xd8);
        auVar5 = vpshufd_avx2(auVar5,0xd8);
        v_06[1] = extraout_RDX_03;
        v_06[0] = (longlong)in_RSI;
        xx_storeu_128(local_4a8,v_06);
        auStack_850 = auVar5._16_16_;
        auVar9 = ZEXT1664(auStack_850);
        v_07[1] = extraout_RDX_04;
        v_07[0] = (longlong)in_RSI;
        xx_storeu_128((void *)((long)local_4a8 + (long)iVar1),v_07);
        local_4b0 = local_4b0 + 4;
        *(undefined4 *)((long)local_4a8 + 0x10) = 0;
        *(undefined4 *)((long)local_4a8 + (long)iVar1 + 0x10) = 0;
        local_4a8 = (void *)((long)local_4a8 + (long)(iVar1 * 2));
        local_49c = local_49c + 2;
      } while (local_49c < iVar3);
    }
    else {
      do {
        auVar6 = auVar9._0_32_;
        yy_loadu_256(local_4b0,in_RSI);
        auVar5 = auVar6;
        yy_loadu_256(local_4b0 + 1,in_RSI);
        auVar7 = auVar5;
        yy_loadu_256(local_4b0 + 2,in_RSI);
        auVar8 = auVar7;
        yy_loadu_256(local_4b0 + 3,in_RSI);
        auVar5 = vpackssdw_avx2(auVar6,auVar5);
        auVar8 = vpackssdw_avx2(auVar7,auVar8);
        auVar5 = vpabsw_avx2(auVar5);
        auVar8 = vpabsw_avx2(auVar8);
        auVar5 = vpacksswb_avx2(auVar5,auVar8);
        auVar8 = vpermq_avx2(auVar5,0xd8);
        auVar5 = vpshufd_avx2(auVar8,0xd8);
        auVar10 = auVar5._0_24_;
        auVar9 = ZEXT3264(auVar5);
        v_01[1] = auVar10._0_8_;
        v_01[2] = auVar10._8_8_;
        v_01[3] = auVar10._16_8_;
        v_01[0] = 0xab8769;
        yy_storeu_256(auVar8._16_8_,v_01);
        local_4b0 = local_4b0 + 4;
        *(undefined4 *)((long)local_4a8 + (long)in_EDX) = 0;
        local_4a8 = (void *)((long)local_4a8 + (long)iVar1);
        local_49c = local_49c + 1;
      } while (local_49c < iVar3);
    }
  }
  return;
}

Assistant:

void av1_txb_init_levels_avx2(const tran_low_t *const coeff, const int width,
                              const int height, uint8_t *const levels) {
  const int stride = height + TX_PAD_HOR;
  const __m256i y_zeros = _mm256_setzero_si256();

  const int32_t bottom_len = sizeof(*levels) * (TX_PAD_BOTTOM * stride);
  uint8_t *bottom_buf_end = levels + (width + TX_PAD_BOTTOM) * stride;
  uint8_t *bottom_buf = bottom_buf_end - ((bottom_len + 31) & (~31));

  do {
    yy_storeu_256(bottom_buf, y_zeros);
    bottom_buf += 32;
  } while (bottom_buf < bottom_buf_end);

  int i = 0;
  uint8_t *ls = levels;
  const tran_low_t *cf = coeff;
  if (height == 4) {
    do {
      const __m256i c0 = yy_loadu_256(cf);
      const __m256i c1 = yy_loadu_256(cf + 8);
      const __m256i abs01 = _mm256_abs_epi16(_mm256_packs_epi32(c0, c1));
      const __m256i abs01_8 = _mm256_packs_epi16(abs01, y_zeros);
      const __m256i res_ = _mm256_shuffle_epi32(abs01_8, 0xd8);
      const __m256i res = _mm256_permute4x64_epi64(res_, 0xd8);
      yy_storeu_256(ls, res);
      ls += 32;
      cf += 16;
      i += 4;
    } while (i < width);
  } else if (height == 8) {
    do {
      const __m256i coeffA = yy_loadu_256(cf);
      const __m256i coeffB = yy_loadu_256(cf + 8);
      const __m256i coeffC = yy_loadu_256(cf + 16);
      const __m256i coeffD = yy_loadu_256(cf + 24);
      const __m256i coeffAB = _mm256_packs_epi32(coeffA, coeffB);
      const __m256i coeffCD = _mm256_packs_epi32(coeffC, coeffD);
      const __m256i absAB = _mm256_abs_epi16(coeffAB);
      const __m256i absCD = _mm256_abs_epi16(coeffCD);
      const __m256i absABCD = _mm256_packs_epi16(absAB, absCD);
      const __m256i res_ = _mm256_permute4x64_epi64(absABCD, 0xd8);
      const __m256i res = _mm256_shuffle_epi32(res_, 0xd8);
      const __m128i res0 = _mm256_castsi256_si128(res);
      const __m128i res1 = _mm256_extracti128_si256(res, 1);
      xx_storel_64(ls, res0);
      *(int32_t *)(ls + height) = 0;
      xx_storel_64(ls + stride, _mm_srli_si128(res0, 8));
      *(int32_t *)(ls + height + stride) = 0;
      xx_storel_64(ls + stride * 2, res1);
      *(int32_t *)(ls + height + stride * 2) = 0;
      xx_storel_64(ls + stride * 3, _mm_srli_si128(res1, 8));
      *(int32_t *)(ls + height + stride * 3) = 0;
      cf += 32;
      ls += stride << 2;
      i += 4;
    } while (i < width);
  } else if (height == 16) {
    do {
      const __m256i coeffA = yy_loadu_256(cf);
      const __m256i coeffB = yy_loadu_256(cf + 8);
      const __m256i coeffC = yy_loadu_256(cf + 16);
      const __m256i coeffD = yy_loadu_256(cf + 24);
      const __m256i coeffAB = _mm256_packs_epi32(coeffA, coeffB);
      const __m256i coeffCD = _mm256_packs_epi32(coeffC, coeffD);
      const __m256i absAB = _mm256_abs_epi16(coeffAB);
      const __m256i absCD = _mm256_abs_epi16(coeffCD);
      const __m256i absABCD = _mm256_packs_epi16(absAB, absCD);
      const __m256i res_ = _mm256_permute4x64_epi64(absABCD, 0xd8);
      const __m256i res = _mm256_shuffle_epi32(res_, 0xd8);
      xx_storeu_128(ls, _mm256_castsi256_si128(res));
      xx_storeu_128(ls + stride, _mm256_extracti128_si256(res, 1));
      cf += 32;
      *(int32_t *)(ls + height) = 0;
      *(int32_t *)(ls + stride + height) = 0;
      ls += stride << 1;
      i += 2;
    } while (i < width);
  } else {
    do {
      const __m256i coeffA = yy_loadu_256(cf);
      const __m256i coeffB = yy_loadu_256(cf + 8);
      const __m256i coeffC = yy_loadu_256(cf + 16);
      const __m256i coeffD = yy_loadu_256(cf + 24);
      const __m256i coeffAB = _mm256_packs_epi32(coeffA, coeffB);
      const __m256i coeffCD = _mm256_packs_epi32(coeffC, coeffD);
      const __m256i absAB = _mm256_abs_epi16(coeffAB);
      const __m256i absCD = _mm256_abs_epi16(coeffCD);
      const __m256i absABCD = _mm256_packs_epi16(absAB, absCD);
      const __m256i res_ = _mm256_permute4x64_epi64(absABCD, 0xd8);
      const __m256i res = _mm256_shuffle_epi32(res_, 0xd8);
      yy_storeu_256(ls, res);
      cf += 32;
      *(int32_t *)(ls + height) = 0;
      ls += stride;
      i += 1;
    } while (i < width);
  }
}